

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O1

void __thiscall Assimp::Blender::DNAParser::Parse(DNAParser *this)

{
  pointer out;
  FileDatabase *pFVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pFVar4;
  pointer pFVar5;
  pointer pFVar6;
  pointer pTVar7;
  pointer pbVar8;
  bool bVar9;
  char cVar10;
  short sVar11;
  ushort uVar12;
  int iVar13;
  mapped_type_conflict3 *pmVar14;
  long lVar15;
  size_t sVar16;
  Logger *this_00;
  runtime_error *prVar17;
  ulong uVar18;
  ulong uVar19;
  Type *s;
  pointer pbVar20;
  pointer pTVar21;
  size_type sVar22;
  StreamReaderAny *stream;
  ulong uVar23;
  vector<Type,_std::allocator<Type>_> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<Type,_std::allocator<Type>_> local_260;
  long *local_248 [2];
  long local_238 [2];
  size_t local_228;
  DNA *local_220;
  long local_218;
  size_type local_210;
  StreamReaderAny *local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  size_t local_178 [34];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_68;
  size_type local_60;
  vector<Assimp::Blender::Structure> *local_58;
  DNAParser *local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_48;
  vector<Assimp::Blender::Field> *local_40;
  ulong local_38;
  
  pFVar1 = this->db;
  stream = (pFVar1->reader).
           super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50 = this;
  bVar9 = match4(stream,"SDNA");
  if (!bVar9) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1e8._0_8_ = local_1e8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"BlenderDNA: Expected SDNA chunk","");
    ::std::runtime_error::runtime_error(prVar17,(string *)local_1e8);
    *(undefined ***)prVar17 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar9 = match4(stream,"NAME");
  if (!bVar9) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1e8._0_8_ = local_1e8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"BlenderDNA: Expected NAME field","");
    ::std::runtime_error::runtime_error(prVar17,(string *)local_1e8);
    *(undefined ***)prVar17 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar13 = StreamReader<true,_true>::Get<int>(stream);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_200,(long)iVar13,(allocator_type *)local_1e8);
  pbVar8 = local_200.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_220 = &pFVar1->dna;
  pbVar20 = local_200.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar20 == pbVar8) {
      while ((*(int *)&stream->current - *(int *)&stream->buffer & 3U) != 0) {
        StreamReader<true,_true>::Get<signed_char>(stream);
      }
      bVar9 = match4(stream,"TYPE");
      if (!bVar9) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1e8._0_8_ = local_1e8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"BlenderDNA: Expected TYPE field","");
        ::std::runtime_error::runtime_error(prVar17,(string *)local_1e8);
        *(undefined ***)prVar17 = &PTR__runtime_error_0082bce0;
        __cxa_throw(prVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar13 = StreamReader<true,_true>::Get<int>(stream);
      ::std::vector<Type,_std::allocator<Type>_>::vector
                (&local_260,(long)iVar13,(allocator_type *)local_1e8);
      pTVar7 = local_260.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pTVar21 = local_260.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (pTVar21 == pTVar7) {
          while ((*(int *)&stream->current - *(int *)&stream->buffer & 3U) != 0) {
            StreamReader<true,_true>::Get<signed_char>(stream);
          }
          bVar9 = match4(stream,"TLEN");
          pTVar7 = local_260.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pTVar21 = local_260.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (!bVar9) {
            prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1e8._0_8_ = local_1e8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1e8,"BlenderDNA: Expected TLEN field","");
            ::std::runtime_error::runtime_error(prVar17,(string *)local_1e8);
            *(undefined ***)prVar17 = &PTR__runtime_error_0082bce0;
            __cxa_throw(prVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
          }
          for (; pTVar21 != pTVar7; pTVar21 = pTVar21 + 1) {
            sVar11 = StreamReader<true,_true>::Get<short>(stream);
            pTVar21->size = (long)sVar11;
          }
          while ((*(int *)&stream->current - *(int *)&stream->buffer & 3U) != 0) {
            StreamReader<true,_true>::Get<signed_char>(stream);
          }
          bVar9 = match4(stream,"STRC");
          if (!bVar9) {
            prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1e8._0_8_ = local_1e8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1e8,"BlenderDNA: Expected STRC field","");
            ::std::runtime_error::runtime_error(prVar17,(string *)local_1e8);
            *(undefined ***)prVar17 = &PTR__runtime_error_0082bce0;
            __cxa_throw(prVar17,&DeadlyImportError::typeinfo,::std::runtime_error::~runtime_error);
          }
          iVar13 = StreamReader<true,_true>::Get<int>(stream);
          local_60 = (size_type)iVar13;
          local_58 = &(pFVar1->dna).structures;
          ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
          reserve(&local_58->
                   super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                  ,local_60);
          if (iVar13 == 0) {
            local_218 = 0;
          }
          else {
            local_68 = &(pFVar1->dna).indices;
            sVar22 = 0;
            local_218 = 0;
            local_208 = stream;
            do {
              local_210 = sVar22;
              uVar12 = StreamReader<true,_true>::Get<short>(stream);
              uVar19 = (ulong)uVar12;
              uVar18 = ((long)local_260.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_260.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
              if (uVar18 < uVar19 || uVar18 - uVar19 == 0) {
                prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"BlenderDNA: Invalid type index in structure name",
                           0x30);
                ::std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8," (there are only ",0x11);
                ::std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8," entries)",9);
                ::std::__cxx11::stringbuf::str();
                ::std::runtime_error::runtime_error(prVar17,(string *)local_248);
                *(undefined ***)prVar17 = &PTR__runtime_error_0082bce0;
                __cxa_throw(prVar17,&DeadlyImportError::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              pSVar2 = (pFVar1->dna).structures.
                       super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                       .
                       super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pSVar3 = (pFVar1->dna).structures.
                       super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                       .
                       super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pmVar14 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        ::operator[](local_68,&local_260.
                                               super__Vector_base<Type,_std::allocator<Type>_>.
                                               _M_impl.super__Vector_impl_data._M_start[uVar19].name
                                    );
              *pmVar14 = ((long)pSVar3 - (long)pSVar2 >> 3) * -0x1111111111111111;
              local_1e8._8_8_ = 0;
              local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
              local_1b8._0_8_ = (pointer)0x0;
              local_1c8._0_8_ = (pointer)0x0;
              local_1c8._8_8_ = (pointer)0x0;
              local_1a8._M_allocated_capacity = local_1a8._M_allocated_capacity & 0xffffffff00000000
              ;
              local_1a8._8_8_ = 0;
              local_198._M_p = (pointer)&local_1a8;
              local_188._M_allocated_capacity = 0;
              local_178[0] = 0xffffffffffffffff;
              local_1e8._0_8_ = local_1e8 + 0x10;
              paStack_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_198._M_p;
              ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
              ::emplace_back<Assimp::Blender::Structure>
                        (&local_58->
                          super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                         ,(Structure *)local_1e8);
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           *)(local_1b8 + 8));
              ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::
              ~vector((vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_> *)
                      local_1c8);
              if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
                operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
              }
              pSVar2 = (pFVar1->dna).structures.
                       super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                       .
                       super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              ::std::__cxx11::string::_M_assign((string *)(pSVar2 + -1));
              uVar12 = StreamReader<true,_true>::Get<short>(stream);
              local_40 = &pSVar2[-1].fields;
              uVar18 = (ulong)uVar12;
              ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::
              reserve(&local_40->
                       super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                      ,uVar18);
              sVar22 = local_210;
              if (uVar12 == 0) {
                sVar16 = 0;
              }
              else {
                local_48 = &pSVar2[-1].indices;
                local_218 = local_218 + uVar18;
                local_228 = 0;
                do {
                  uVar12 = StreamReader<true,_true>::Get<short>(stream);
                  uVar23 = (ulong)uVar12;
                  uVar19 = ((long)local_260.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)local_260.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
                  local_38 = uVar18;
                  if (uVar19 < uVar23 || uVar19 - uVar23 == 0) {
                    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,
                               "BlenderDNA: Invalid type index in structure field ",0x32);
                    ::std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8," (there are only ",0x11);
                    ::std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8," entries)",9);
                    ::std::__cxx11::stringbuf::str();
                    ::std::runtime_error::runtime_error(prVar17,(string *)local_248);
                    *(undefined ***)prVar17 = &PTR__runtime_error_0082bce0;
                    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  local_1e8._24_8_ = 0;
                  local_1b8._8_8_ = 0;
                  local_198._M_p = (pointer)0x0;
                  paStack_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x0;
                  local_1a8._M_allocated_capacity = 0;
                  local_1a8._8_8_ = 0;
                  local_188._M_allocated_capacity = 0;
                  local_1e8._8_8_ = 0;
                  local_1e8._16_8_ = 0;
                  local_1c8._8_8_ = (pointer)0x0;
                  local_1b8._0_8_ = (pointer)0x0;
                  local_1e8._0_8_ = local_1e8 + 0x10;
                  local_1c8._0_8_ = (pointer)local_1b8;
                  ::std::vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>::
                  emplace_back<Assimp::Blender::Field>
                            (&local_40->
                              super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                             ,(Field *)local_1e8);
                  if ((pointer)local_1c8._0_8_ != (pointer)local_1b8) {
                    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
                  }
                  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
                    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
                  }
                  pFVar4 = pSVar2[-1].fields.
                           super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                           .
                           super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  pFVar4[-1].offset = local_228;
                  ::std::__cxx11::string::_M_assign((string *)&pFVar4[-1].type);
                  pFVar4[-1].size =
                       local_260.super__Vector_base<Type,_std::allocator<Type>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar23].size;
                  uVar12 = StreamReader<true,_true>::Get<short>(local_208);
                  if ((ulong)((long)local_200.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_200.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar12
                     ) {
                    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8,
                               "BlenderDNA: Invalid name index in structure field ",0x32);
                    ::std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8," (there are only ",0x11);
                    ::std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1e8," entries)",9);
                    ::std::__cxx11::stringbuf::str();
                    ::std::runtime_error::runtime_error(prVar17,(string *)local_248);
                    *(undefined ***)prVar17 = &PTR__runtime_error_0082bce0;
                    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  out = pFVar4 + -1;
                  ::std::__cxx11::string::_M_assign((string *)out);
                  pFVar4[-1].flags = 0;
                  if (*pFVar4[-1].name._M_dataplus._M_p == '*') {
                    pFVar4[-1].size = (ulong)local_50->db->i64bit * 4 + 4;
                    pFVar4[-1].flags = 1;
                  }
                  if (pFVar4[-1].name._M_dataplus._M_p[pFVar4[-1].name._M_string_length - 1] == ']')
                  {
                    lVar15 = ::std::__cxx11::string::find((char)out,0x5b);
                    if (lVar15 == -1) {
                      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,
                                 "BlenderDNA: Encountered invalid array declaration ",0x32);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,pFVar4[-1].name._M_dataplus._M_p,
                                 pFVar4[-1].name._M_string_length);
                      ::std::__cxx11::stringbuf::str();
                      ::std::runtime_error::runtime_error(prVar17,(string *)local_248);
                      *(undefined ***)prVar17 = &PTR__runtime_error_0082bce0;
                      __cxa_throw(prVar17,&DeadlyImportError::typeinfo,
                                  ::std::runtime_error::~runtime_error);
                    }
                    *(byte *)&pFVar4[-1].flags = (byte)pFVar4[-1].flags | 2;
                    DNA::ExtractArraySize(&out->name,pFVar4[-1].array_sizes);
                    ::std::__cxx11::string::substr((ulong)local_1e8,(ulong)out);
                    ::std::__cxx11::string::operator=((string *)out,(string *)local_1e8);
                    if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
                      operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
                    }
                    pFVar4[-1].size =
                         pFVar4[-1].array_sizes[1] * pFVar4[-1].array_sizes[0] * pFVar4[-1].size;
                    sVar22 = local_210;
                  }
                  pFVar5 = pSVar2[-1].fields.
                           super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                           .
                           super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pFVar6 = pSVar2[-1].fields.
                           super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                           .
                           super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  pmVar14 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            ::operator[](local_48,&out->name);
                  *pmVar14 = ((long)pFVar6 - (long)pFVar5 >> 3) * 0x4ec4ec4ec4ec4ec5 - 1;
                  sVar16 = local_228 + pFVar4[-1].size;
                  uVar18 = local_38 - 1;
                  stream = local_208;
                  local_228 = sVar16;
                } while (uVar18 != 0);
              }
              pSVar2[-1].size = sVar16;
              sVar22 = sVar22 + 1;
            } while (sVar22 != local_60);
          }
          this_00 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[17]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1e8,(char (*) [17])"BlenderDNA: Got ");
          ::std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1e8," structures with totally ",0x19);
          ::std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8," fields",7);
          ::std::__cxx11::stringbuf::str();
          Logger::debug(this_00,(char *)local_248[0]);
          if (local_248[0] != local_238) {
            operator_delete(local_248[0],local_238[0] + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
          ::std::ios_base::~ios_base((ios_base *)local_178);
          DNA::DumpToFile(local_220);
          DNA::AddPrimitiveStructures(local_220);
          DNA::RegisterConverters(local_220);
          ::std::vector<Type,_std::allocator<Type>_>::~vector(&local_260);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_200);
          return;
        }
        do {
          cVar10 = StreamReader<true,_true>::Get<signed_char>(stream);
          if (cVar10 == '\0') break;
          ::std::__cxx11::string::push_back((char)pTVar21 + '\b');
        } while (cVar10 != '\0');
        pTVar21 = pTVar21 + 1;
      } while( true );
    }
    do {
      cVar10 = StreamReader<true,_true>::Get<signed_char>(stream);
      if (cVar10 == '\0') break;
      ::std::__cxx11::string::push_back((char)pbVar20);
    } while (cVar10 != '\0');
    pbVar20 = pbVar20 + 1;
  } while( true );
}

Assistant:

void DNAParser::Parse ()
{
    StreamReaderAny& stream = *db.reader.get();
    DNA& dna = db.dna;

    if(!match4(stream,"SDNA")) {
        throw DeadlyImportError("BlenderDNA: Expected SDNA chunk");
    }

    // name dictionary
    if(!match4(stream,"NAME")) {
        throw DeadlyImportError("BlenderDNA: Expected NAME field");
    }

    std::vector<std::string> names (stream.GetI4());
    for(std::string& s : names) {
        while (char c = stream.GetI1()) {
            s += c;
        }
    }

    // type dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"TYPE")) {
        throw DeadlyImportError("BlenderDNA: Expected TYPE field");
    }

    std::vector<Type> types (stream.GetI4());
    for(Type& s : types) {
        while (char c = stream.GetI1()) {
            s.name += c;
        }
    }

    // type length dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"TLEN")) {
        throw DeadlyImportError("BlenderDNA: Expected TLEN field");
    }

    for(Type& s : types) {
        s.size = stream.GetI2();
    }

    // structures dictionary
    for (;stream.GetCurrentPos() & 0x3; stream.GetI1());
    if(!match4(stream,"STRC")) {
        throw DeadlyImportError("BlenderDNA: Expected STRC field");
    }

    size_t end = stream.GetI4(), fields = 0;

    dna.structures.reserve(end);
    for(size_t i = 0; i != end; ++i) {

        uint16_t n = stream.GetI2();
        if (n >= types.size()) {
            throw DeadlyImportError((format(),
                "BlenderDNA: Invalid type index in structure name" ,n,
                " (there are only ", types.size(), " entries)"
            ));
        }

        // maintain separate indexes
        dna.indices[types[n].name] = dna.structures.size();

        dna.structures.push_back(Structure());
        Structure& s = dna.structures.back();
        s.name  = types[n].name;
        //s.index = dna.structures.size()-1;

        n = stream.GetI2();
        s.fields.reserve(n);

        size_t offset = 0;
        for (size_t m = 0; m < n; ++m, ++fields) {

            uint16_t j = stream.GetI2();
            if (j >= types.size()) {
                throw DeadlyImportError((format(),
                    "BlenderDNA: Invalid type index in structure field ", j,
                    " (there are only ", types.size(), " entries)"
                ));
            }
            s.fields.push_back(Field());
            Field& f = s.fields.back();
            f.offset = offset;

            f.type = types[j].name;
            f.size = types[j].size;

            j = stream.GetI2();
            if (j >= names.size()) {
                throw DeadlyImportError((format(),
                    "BlenderDNA: Invalid name index in structure field ", j,
                    " (there are only ", names.size(), " entries)"
                ));
            }

            f.name = names[j];
            f.flags = 0u;

            // pointers always specify the size of the pointee instead of their own.
            // The pointer asterisk remains a property of the lookup name.
            if (f.name[0] == '*') {
                f.size = db.i64bit ? 8 : 4;
                f.flags |= FieldFlag_Pointer;
            }

            // arrays, however, specify the size of a single element so we
            // need to parse the (possibly multi-dimensional) array declaration
            // in order to obtain the actual size of the array in the file.
            // Also we need to alter the lookup name to include no array
            // brackets anymore or size fixup won't work (if our size does
            // not match the size read from the DNA).
            if (*f.name.rbegin() == ']') {
                const std::string::size_type rb = f.name.find('[');
                if (rb == std::string::npos) {
                    throw DeadlyImportError((format(),
                        "BlenderDNA: Encountered invalid array declaration ",
                        f.name
                    ));
                }

                f.flags |= FieldFlag_Array;
                DNA::ExtractArraySize(f.name,f.array_sizes);
                f.name = f.name.substr(0,rb);

                f.size *= f.array_sizes[0] * f.array_sizes[1];
            }

            // maintain separate indexes
            s.indices[f.name] = s.fields.size()-1;
            offset += f.size;
        }
        s.size = offset;
    }

    ASSIMP_LOG_DEBUG_F( "BlenderDNA: Got ", dna.structures.size()," structures with totally ",fields," fields");

#ifdef ASSIMP_BUILD_BLENDER_DEBUG
    dna.DumpToFile();
#endif

    dna.AddPrimitiveStructures();
    dna.RegisterConverters();
}